

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O1

APInt __thiscall llvm::APInt::sextOrTrunc(APInt *this,uint width)

{
  uint uVar1;
  uint in_EDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined4 in_register_00000034;
  double in_XMM0_Qa;
  APInt AVar3;
  undefined8 uVar2;
  
  uVar1 = *(uint *)(CONCAT44(in_register_00000034,width) + 8);
  if (uVar1 < in_EDX) {
    AVar3 = sext(this,width);
    uVar2 = AVar3._8_8_;
  }
  else if (in_EDX < uVar1) {
    trunc(this,in_XMM0_Qa);
    uVar2 = extraout_RDX;
  }
  else {
    APInt(this,(APInt *)CONCAT44(in_register_00000034,width));
    uVar2 = extraout_RDX_00;
  }
  AVar3._8_8_ = uVar2;
  AVar3.U.pVal = (uint64_t *)this;
  return AVar3;
}

Assistant:

APInt APInt::sextOrTrunc(unsigned width) const {
  if (BitWidth < width)
    return sext(width);
  if (BitWidth > width)
    return trunc(width);
  return *this;
}